

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O3

int Sbd_StoPrepareSet(Sbd_Sto_t *p,int iObj,int Index)

{
  Sbd_Cut_t *pSVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int i;
  int *piVar5;
  int Cost_1;
  uint uVar6;
  long lVar7;
  int *piVar8;
  int Cost;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  Vec_Int_t *pVVar17;
  
  if ((iObj < 0) || (p->vCuts->nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  piVar4 = p->vCuts->pArray[(uint)iObj].pArray;
  iVar9 = *piVar4;
  if (0 < iVar9) {
    piVar8 = piVar4 + 1;
    piVar5 = p->pCuts[(uint)Index][0].pLeaves;
    lVar12 = 0;
    do {
      pSVar1 = p->pCuts[(uint)Index] + lVar12;
      uVar6 = *(uint *)&p->pCuts[(uint)Index][lVar12].field_0x14 & 0xfffffff | *piVar8 << 0x1c;
      *(uint *)&p->pCuts[(uint)Index][lVar12].field_0x14 = uVar6;
      iVar9 = *piVar8;
      if (0 < iVar9) {
        lVar7 = 0;
        do {
          piVar5[lVar7] = piVar8[lVar7 + 1];
          iVar9 = *piVar8;
          lVar7 = lVar7 + 1;
        } while (lVar7 < iVar9);
        uVar6 = *(uint *)&pSVar1->field_0x14;
      }
      pSVar1->iFunc = piVar8[(long)iVar9 + 1];
      if (uVar6 < 0x10000000) {
        uVar14 = 0;
        pSVar1->Sign = 0;
        pSVar1->Cost = 0;
        pSVar1->CostLev = 0;
        pVVar17 = p->vDelays;
      }
      else {
        uVar13 = (ulong)(uVar6 >> 0x1c);
        uVar10 = 0;
        uVar11 = 0;
        do {
          uVar11 = uVar11 | 1L << ((ulong)(byte)piVar5[uVar10] & 0x3f);
          uVar10 = uVar10 + 1;
        } while (uVar13 != uVar10);
        pSVar1->Sign = uVar11;
        pVVar17 = p->vDelays;
        uVar11 = 0;
        iVar9 = 0;
        do {
          iVar2 = piVar5[uVar11];
          if (((long)iVar2 < 0) || (pVVar17->nSize <= iVar2)) goto LAB_0054a9e6;
          iVar9 = iVar9 + pVVar17->pArray[iVar2];
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
        pSVar1->Cost = iVar9;
        uVar11 = 0;
        iVar9 = 0;
        do {
          iVar2 = piVar5[uVar11];
          if (((long)iVar2 < 0) || (p->vLevels->nSize <= iVar2)) goto LAB_0054a9e6;
          iVar9 = iVar9 + p->vLevels->pArray[iVar2];
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
        pSVar1->CostLev = iVar9;
        uVar11 = 0;
        uVar14 = 0;
        do {
          iVar9 = piVar5[uVar11];
          if (((long)iVar9 < 0) || (p->vRefs->nSize <= iVar9)) goto LAB_0054a9e6;
          uVar14 = uVar14 + (p->vRefs->pArray[iVar9] == 1);
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
        uVar14 = uVar14 & 0x1ff;
      }
      *(uint *)&pSVar1->field_0x14 = uVar6 & 0xfffffe00 | uVar14;
      if (pVVar17->nSize <= iObj) {
LAB_0054a9e6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar15 = 0;
      if (0xfffffff < uVar6) {
        uVar11 = 0;
        uVar15 = 0;
        do {
          uVar16 = piVar5[uVar11];
          if (((long)(int)uVar16 < 0) || ((uint)pVVar17->nSize <= uVar16)) goto LAB_0054a9e6;
          uVar15 = uVar15 + (-2 < pVVar17->pArray[(int)uVar16] - pVVar17->pArray[(uint)iObj]);
          uVar11 = uVar11 + 1;
        } while (uVar6 >> 0x1c != uVar11);
        uVar15 = (uVar15 & 0x1ff) << 9;
      }
      *(uint *)&pSVar1->field_0x14 = uVar6 & 0xfffc0000 | uVar14 | uVar15;
      if (pVVar17->nSize <= iObj) goto LAB_0054a9e6;
      uVar16 = 0;
      if (0xfffffff < uVar6) {
        uVar11 = 0;
        uVar16 = 0;
        do {
          uVar3 = piVar5[uVar11];
          if (((long)(int)uVar3 < 0) || ((uint)pVVar17->nSize <= uVar3)) goto LAB_0054a9e6;
          uVar16 = uVar16 + (pVVar17->pArray[(int)uVar3] - pVVar17->pArray[(uint)iObj] == -2);
          uVar11 = uVar11 + 1;
        } while (uVar6 >> 0x1c != uVar11);
        uVar16 = (uVar16 & 0x3ff) << 0x12;
      }
      *(uint *)&pSVar1->field_0x14 = uVar6 & 0xf0000000 | uVar14 | uVar15 | uVar16;
      lVar12 = lVar12 + 1;
      piVar8 = piVar8 + (long)*piVar8 + 2;
      iVar9 = *piVar4;
      piVar5 = piVar5 + 0x10;
    } while (lVar12 < iVar9);
  }
  return iVar9;
}

Assistant:

static inline int Sbd_StoPrepareSet( Sbd_Sto_t * p, int iObj, int Index )
{
    Vec_Int_t * vThis = Vec_WecEntry( p->vCuts, iObj );
    int i, v, * pCut, * pList = Vec_IntArray( vThis );
    Sbd_ForEachCut( pList, pCut, i )
    {
        Sbd_Cut_t * pCutTemp = &p->pCuts[Index][i];
        pCutTemp->nLeaves = pCut[0];
        for ( v = 1; v <= pCut[0]; v++ )
            pCutTemp->pLeaves[v-1] = pCut[v];
        pCutTemp->iFunc = pCut[pCut[0]+1];
        pCutTemp->Sign = Sbd_CutGetSign( pCutTemp );
        pCutTemp->Cost = Sbd_CutCost( p, pCutTemp );
        pCutTemp->CostLev = Sbd_CutCostLev( p, pCutTemp );
        pCutTemp->nTreeLeaves = Sbd_CutTreeLeaves( p, pCutTemp );
        pCutTemp->nSlowLeaves = Sbd_CutSlowLeaves( p, iObj, pCutTemp );
        pCutTemp->nTopLeaves  = Sbd_CutTopLeaves( p, iObj, pCutTemp );
    }
    return pList[0];
}